

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<unsigned_long,_unsigned_long>
httplib::detail::get_range_offset_and_length(Request *req,size_t content_length,size_t index)

{
  const_reference pvVar1;
  long *plVar2;
  size_type in_RDX;
  long in_RSI;
  long in_RDI;
  pair<int,_unsigned_long> pVar3;
  ssize_t slen;
  value_type r;
  unsigned_long *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  pair<long,_unsigned_long> local_78;
  long local_68 [3];
  undefined4 local_4c;
  pair<int,_unsigned_long> local_48;
  long local_38;
  long local_30;
  long local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_20 = in_RSI;
  pvVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                     ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                      (in_RDI + 0x158),in_RDX);
  local_38 = pvVar1->first;
  local_30 = pvVar1->second;
  if ((local_38 == -1) && (local_30 == -1)) {
    local_4c = 0;
    pVar3 = std::make_pair<int,unsigned_long&>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_48.second = pVar3.second;
    local_48.first = pVar3.first;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_unsigned_long,_true>(&local_10,&local_48);
  }
  else {
    local_68[2] = local_20;
    if (local_38 == -1) {
      local_68[1] = 0;
      local_68[0] = local_20 - local_30;
      plVar2 = std::max<long>(local_68 + 1,local_68);
      local_38 = *plVar2;
      local_30 = local_68[2] + -1;
    }
    if (local_30 == -1) {
      local_30 = local_68[2] + -1;
    }
    local_78 = std::make_pair<long&,unsigned_long>
                         ((long *)((local_30 - local_38) + 1),in_stack_ffffffffffffff78);
    std::pair<unsigned_long,_unsigned_long>::pair<long,_unsigned_long,_true>(&local_10,&local_78);
  }
  return local_10;
}

Assistant:

inline std::pair<size_t, size_t>
            get_range_offset_and_length(const Request& req, size_t content_length,
                size_t index) {
            auto r = req.ranges[index];

            if (r.first == -1 && r.second == -1) {
                return std::make_pair(0, content_length);
            }

            auto slen = static_cast<ssize_t>(content_length);

            if (r.first == -1) {
                r.first = (std::max)(static_cast<ssize_t>(0), slen - r.second);
                r.second = slen - 1;
            }

            if (r.second == -1) { r.second = slen - 1; }
            return std::make_pair(r.first, static_cast<size_t>(r.second - r.first) + 1);
        }